

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_>::operator=
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> *this,
          ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> *other)

{
  ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> *other_local;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
  other->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *)0x0;
  other->endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }